

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpectrumPlus3.cpp
# Opt level: O0

bool MatchBlock(uint8_t *pbInput_,uint8_t *pbMatch_,char *psczRules_)

{
  char cVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  char *pcVar4;
  char *local_28;
  char *psczRules__local;
  uint8_t *pbMatch__local;
  uint8_t *pbInput__local;
  
  local_28 = psczRules_;
  psczRules__local = (char *)pbMatch_;
  pbMatch__local = pbInput_;
  do {
    do {
      while( true ) {
        while( true ) {
          if (*local_28 == '\0') {
            return true;
          }
          pcVar4 = local_28 + 1;
          cVar1 = *local_28;
          local_28 = pcVar4;
          if (cVar1 != 'n') break;
          psczRules__local = psczRules__local + 1;
          pbMatch__local = pbMatch__local + 1;
        }
        if (cVar1 != 'o') break;
        pcVar4 = psczRules__local + 1;
        uVar2 = *psczRules__local;
        psczRules__local = pcVar4;
        if (*pbMatch__local == uVar2) {
          pbMatch__local = pbMatch__local + 1;
        }
      }
    } while (cVar1 != 'y');
    uVar2 = *pbMatch__local;
    uVar3 = *psczRules__local;
    psczRules__local = psczRules__local + 1;
    pbMatch__local = pbMatch__local + 1;
  } while (uVar2 == uVar3);
  return false;
}

Assistant:

static bool MatchBlock(const uint8_t* pbInput_, const uint8_t* pbMatch_, const char* psczRules_)
{
    while (*psczRules_)
    {
        switch (*psczRules_++)
        {
            // Character must match
        case 'y':
            if (*pbInput_++ != *pbMatch_++)
                return false;
            break;

            // Character not expected to match
        case 'n':
            ++pbInput_;
            ++pbMatch_;
            break;

            // Skip optional input if matched
        case 'o':
            if (*pbInput_ == *pbMatch_++)
                ++pbInput_;
            break;
        }
    }

    // Fully matched
    return true;
}